

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc-reno.c
# Opt level: O3

uint32_t quicly_cc_calc_initial_cwnd(uint32_t max_packets,uint16_t max_udp_payload_size)

{
  uint uVar1;
  uint32_t uVar2;
  undefined2 in_register_00000032;
  
  uVar2 = 2;
  if (2 < max_packets) {
    uVar2 = max_packets;
  }
  uVar1 = 0x5c0;
  if (CONCAT22(in_register_00000032,max_udp_payload_size) < 0x5c0) {
    uVar1 = CONCAT22(in_register_00000032,max_udp_payload_size);
  }
  return uVar1 * uVar2;
}

Assistant:

uint32_t quicly_cc_calc_initial_cwnd(uint32_t max_packets, uint16_t max_udp_payload_size)
{
    static const uint32_t mtu_max = 1472;

    /* apply filters to the two arguments */
    if (max_packets < QUICLY_MIN_CWND)
        max_packets = QUICLY_MIN_CWND;
    if (max_udp_payload_size > mtu_max)
        max_udp_payload_size = mtu_max;

    return max_packets * max_udp_payload_size;
}